

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas2.cxx
# Opt level: O0

void HBLAS2::hblas2_gemv_square_LDSame<HAXX::quaternion<double>,HAXX::quaternion<double>,(char)67>
               (void)

{
  quaternion<double> ALPHA_00;
  quaternion<double> BETA_00;
  bool bVar1;
  ostream *poVar2;
  quaternion<double> *pqVar3;
  quaternion<double> *__x;
  reference pvVar4;
  reference __y;
  reference pvVar5;
  quaternion<double> tmp;
  int32_t AStride;
  int32_t ACOL;
  int32_t AROW;
  int i;
  stringstream ss;
  quaternion<double> BETA;
  quaternion<double> ALPHA;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> YC;
  quaternion<double> *x_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2_2;
  quaternion<double> *x_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2_1;
  quaternion<double> *x;
  iterator __end2;
  iterator __begin2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> Y;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> X;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> A;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_fffffffffffff928;
  undefined1 pv_;
  uniform_real_distribution<double> *in_stack_fffffffffffff930;
  quaternion<double> *__x_00;
  lazy_ostream *prev;
  allocator_type *in_stack_fffffffffffff940;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *this;
  undefined4 in_stack_fffffffffffff948;
  undefined4 in_stack_fffffffffffff94c;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffff950;
  quaternion<double> *__q;
  undefined4 in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff97c;
  quaternion<double> *in_stack_fffffffffffff980;
  undefined8 in_stack_fffffffffffff990;
  undefined8 in_stack_fffffffffffff998;
  undefined8 uVar6;
  undefined8 in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a8;
  undefined4 in_stack_fffffffffffff9ac;
  size_type __n;
  int32_t iVar7;
  basic_cstring<const_char> local_588;
  basic_cstring<const_char> local_578;
  undefined1 local_568 [32];
  undefined8 local_548;
  quaternion<double> *in_stack_fffffffffffffb58;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffb60;
  undefined1 local_480 [24];
  undefined1 local_468 [16];
  basic_cstring<const_char> local_458;
  double local_448;
  quaternion<double> *local_440;
  double local_438;
  quaternion<double> *local_430;
  double local_428;
  double local_420;
  double local_418;
  double local_410;
  double in_stack_fffffffffffffbf8;
  quaternion<double> *in_stack_fffffffffffffc00;
  double in_stack_fffffffffffffc08;
  int32_t INCX;
  quaternion<double> *in_stack_fffffffffffffc10;
  int N;
  int local_3dc;
  string local_390 [32];
  stringstream local_370 [16];
  ostream local_360 [376];
  quaternion<double> *local_1e8;
  undefined8 uStack_1e0;
  int32_t iStack_1dc;
  quaternion<double> *pqStack_1d8;
  undefined8 uStack_1d0;
  int32_t iStack_1cc;
  quaternion<double> *local_1c8;
  quaternion<double> *pqStack_1c0;
  lazy_ostream *plStack_1b8;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *pvStack_1b0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_1a8;
  result_type_conflict1 local_190;
  result_type_conflict1 local_188;
  result_type_conflict1 local_180;
  result_type_conflict1 local_178;
  quaternion<double> local_170;
  reference local_150;
  quaternion<double> *local_148;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_140;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_138;
  result_type_conflict1 local_130;
  result_type_conflict1 local_128;
  result_type_conflict1 local_120;
  result_type_conflict1 local_118;
  quaternion<double> local_110;
  reference local_f0;
  quaternion<double> *local_e8;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_e0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_d8;
  result_type_conflict1 local_d0;
  result_type_conflict1 local_c8;
  result_type_conflict1 local_c0;
  result_type_conflict1 local_b8;
  quaternion<double> local_b0;
  reference local_90;
  quaternion<double> *local_88;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_80;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_78;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_68;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_48 [2];
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_18;
  
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1f63ac);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffff950,CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948)
             ,in_stack_fffffffffffff940);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1f63d5);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1f63ea);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffff950,CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948)
             ,in_stack_fffffffffffff940);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1f6413);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1f6428);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffff950,CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948)
             ,in_stack_fffffffffffff940);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1f6451);
  local_78 = local_48;
  local_80._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
                  in_stack_fffffffffffff928);
  local_88 = (quaternion<double> *)
             std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                       ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                         *)in_stack_fffffffffffff928);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff930,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff928);
    if (!bVar1) break;
    local_90 = __gnu_cxx::
               __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
               ::operator*(&local_80);
    local_b8 = std::uniform_real_distribution<double>::operator()
                         (in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    local_c0 = std::uniform_real_distribution<double>::operator()
                         (in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    local_c8 = std::uniform_real_distribution<double>::operator()
                         (in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    local_d0 = std::uniform_real_distribution<double>::operator()
                         (in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    HAXX::quaternion<double>::quaternion(&local_b0,&local_b8,&local_c0,&local_c8,&local_d0);
    local_90->_M_real = local_b0._M_real;
    local_90->_M_imag_i = local_b0._M_imag_i;
    local_90->_M_imag_j = local_b0._M_imag_j;
    local_90->_M_imag_k = local_b0._M_imag_k;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_80);
  }
  local_d8 = &local_68;
  local_e0._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
                  in_stack_fffffffffffff928);
  local_e8 = (quaternion<double> *)
             std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                       ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                         *)in_stack_fffffffffffff928);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff930,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff928);
    if (!bVar1) break;
    local_f0 = __gnu_cxx::
               __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
               ::operator*(&local_e0);
    local_118 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    local_120 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    local_128 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    local_130 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    HAXX::quaternion<double>::quaternion(&local_110,&local_118,&local_120,&local_128,&local_130);
    local_f0->_M_real = local_110._M_real;
    local_f0->_M_imag_i = local_110._M_imag_i;
    local_f0->_M_imag_j = local_110._M_imag_j;
    local_f0->_M_imag_k = local_110._M_imag_k;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_e0);
  }
  local_138 = &local_18;
  local_140._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
                  in_stack_fffffffffffff928);
  local_148 = (quaternion<double> *)
              std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                        ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          *)in_stack_fffffffffffff928);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff930,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff928);
    if (!bVar1) break;
    local_150 = __gnu_cxx::
                __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                ::operator*(&local_140);
    local_178 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    local_180 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    local_188 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    local_190 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff930,in_stack_fffffffffffff928);
    HAXX::quaternion<double>::quaternion(&local_170,&local_178,&local_180,&local_188,&local_190);
    local_150->_M_real = local_170._M_real;
    local_150->_M_imag_i = local_170._M_imag_i;
    local_150->_M_imag_j = local_170._M_imag_j;
    local_150->_M_imag_k = local_170._M_imag_k;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_140);
  }
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff980,
             (vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
  genRandom<HAXX::quaternion<double>>();
  genRandom<HAXX::quaternion<double>>();
  std::__cxx11::stringstream::stringstream(local_370);
  poVar2 = std::operator<<(local_360,"hblas2_gemv_square_");
  std::operator<<(poVar2,'C');
  std::operator<<(local_360,"Q");
  std::operator<<(local_360,"Q");
  std::operator<<(local_360,"_LDSame");
  std::__cxx11::stringstream::str();
  poVar2 = std::operator<<((ostream *)&std::cout,local_390);
  poVar2 = std::operator<<(poVar2," will use");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_390);
  poVar2 = std::operator<<((ostream *)&std::cout,"  ALPHA = ");
  iVar7 = (int32_t)poVar2;
  pqVar3 = (quaternion<double> *)
           HAXX::operator<<(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  std::ostream::operator<<(pqVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"  BETA = ");
  __x = (quaternion<double> *)HAXX::operator<<(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  std::ostream::operator<<(__x,std::endl<char,std::char_traits<char>>);
  __n = 0;
  pvVar4 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
           operator[](&local_18,0);
  __y = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
        operator[](local_48,__n);
  pvVar5 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
           operator[](&local_68,__n);
  ALPHA_00._M_imag_i = (double)in_stack_fffffffffffff998;
  ALPHA_00._M_real = (double)in_stack_fffffffffffff990;
  ALPHA_00._M_imag_j = (double)in_stack_fffffffffffff9a0;
  ALPHA_00._M_imag_k._0_4_ = in_stack_fffffffffffff9a8;
  ALPHA_00._M_imag_k._4_4_ = in_stack_fffffffffffff9ac;
  BETA_00._M_imag_i = (double)__y;
  BETA_00._M_real = (double)pvVar4;
  BETA_00._M_imag_j = (double)__x;
  BETA_00._M_imag_k = (double)poVar2;
  HAXX::
  HBLAS_GEMV<double,HAXX::quaternion<double>,HAXX::quaternion<double>,HAXX::quaternion<double>,HAXX::quaternion<double>>
            ((char)((ulong)pvVar5 >> 0x38),(int32_t)pvVar5,iStack_1cc,ALPHA_00,pqStack_1d8,
             iStack_1dc,local_1e8,(int32_t)__n,BETA_00,pqVar3,iVar7);
  pqVar3 = local_1c8;
  __x_00 = pqStack_1c0;
  prev = plStack_1b8;
  this = pvStack_1b0;
  __q = local_1e8;
  for (local_3dc = 0; iVar7 = (int32_t)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
      INCX = (int32_t)((ulong)in_stack_fffffffffffffc08 >> 0x20), local_3dc < 100;
      local_3dc = local_3dc + 1) {
    local_410 = 0.0;
    local_418 = 0.0;
    local_420 = 0.0;
    local_428 = 0.0;
    N = local_3dc;
    HAXX::quaternion<double>::quaternion
              ((quaternion<double> *)&stack0xfffffffffffffbf8,&local_410,&local_418,&local_420,
               &local_428);
    std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
              (&local_18,(long)(N * 100));
    std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
              (local_48,0);
    HAXX::HBLAS_DOTCV<double>(N,in_stack_fffffffffffffc10,INCX,in_stack_fffffffffffffc00,iVar7);
    in_stack_fffffffffffffbf8 = local_448;
    in_stack_fffffffffffffc00 = local_440;
    in_stack_fffffffffffffc08 = local_438;
    in_stack_fffffffffffffc10 = local_430;
    do {
      uVar6 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_458,
                 "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx"
                 ,0x58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)__x_00);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar6,&local_458,0x47,local_468);
      HAXX::operator*(__x,__y);
      std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
                (&local_1a8,(long)local_3dc);
      HAXX::operator*(__x,__y);
      HAXX::operator+(__x_00,pqVar3);
      std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
                (&local_68,(long)local_3dc);
      HAXX::inv<double>(in_stack_fffffffffffff980);
      HAXX::operator*(__x,__y);
      local_548 = 0x3ff0000000000000;
      HAXX::operator-(__x_00,&pqVar3->_M_real);
      pv_ = (undefined1)((ulong)pqVar3 >> 0x38);
      HAXX::norm<double>(__q);
      boost::test_tools::assertion_result::assertion_result((assertion_result *)__x_00,(bool)pv_);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_578,
                 "( HAXX::norm(((ALPHA*tmp + BETA*YC[i]) * HAXX::inv(Y[i]))- 1.) < 1e-12 )",0x48);
      boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)__x_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_588,
                 "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx"
                 ,0x58);
      pqVar3 = (quaternion<double> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_480,local_568,&local_588,0x47,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1f6fde);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1f6feb);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  std::__cxx11::stringstream::~stringstream(local_370);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector(this);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector(this);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector(this);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector(this);
  return;
}

Assistant:

void hblas2_gemv_square_LDSame() {

  // Random Quaternion vectors and matricies
  std::vector<HAXX::quaternion<double>> 
    A(HBLAS2_MATLEN), X(HBLAS1_VECLEN), Y(HBLAS1_VECLEN);

  for(auto &x : X) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : Y) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : A) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));

  std::vector<HAXX::quaternion<double>> YC(Y);

  _AlphaF ALPHA = genRandom<_AlphaF>();
  _BetaF  BETA = genRandom<_BetaF>();

  std::stringstream ss;

  ss << "hblas2_gemv_square_" << _TA;
  if(std::is_same<double,_AlphaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_AlphaF>::value) ss << "C";
  else ss << "Q";
  if(std::is_same<double,_BetaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_BetaF>::value) ss << "C";
  else ss << "Q";
  ss << "_LDSame";

  std::cout << ss.str() << " will use" << std::endl;
  std::cout << "  ALPHA = " << ALPHA << std::endl;
  std::cout << "  BETA = " << BETA << std::endl;

  HBLAS_GEMV(_TA,HBLAS1_VECLEN,HBLAS1_VECLEN,ALPHA,&A[0],HBLAS1_VECLEN,&X[0],1,
    BETA,&Y[0],1);

  for(int i = 0; i < HBLAS1_VECLEN; i++) {
    HAXX_INT AROW = 0;
    HAXX_INT ACOL = i;
    HAXX_INT AStride = 1;
    if( _TA == 'N' ) {
      AROW = i;
      ACOL = 0;
      AStride = HBLAS1_VECLEN;
    }

    HAXX::quaternion<double> tmp;
    if( _TA == 'C' )
      tmp = HBLAS_DOTCV(HBLAS1_VECLEN,&A[RANK2_INDX(AROW,ACOL,HBLAS1_VECLEN)],
          AStride,&X[0],1);
    else
      tmp = HBLAS_DOTUV(HBLAS1_VECLEN,&A[RANK2_INDX(AROW,ACOL,HBLAS1_VECLEN)],
          AStride,&X[0],1);

    BOOST_CHECK(CMP_Q(ALPHA*tmp + BETA*YC[i],Y[i]));
  }

}